

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_namelist.cc
# Opt level: O3

char * ctemplate::TemplateNamelist::RegisterTemplate(char *name)

{
  _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,ctemplate::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  *p_Var1;
  __hashtable *__h;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar2;
  __node_gen_type __node_gen;
  allocator local_41;
  _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,ctemplate::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  *local_40;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  if (namelist__abi_cxx11_ ==
      (_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,ctemplate::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
       *)0x0) {
    namelist__abi_cxx11_ =
         (_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,ctemplate::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
          *)operator_new(0x38);
    *(_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,ctemplate::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      **)namelist__abi_cxx11_ = namelist__abi_cxx11_ + 0x30;
    *(undefined8 *)(namelist__abi_cxx11_ + 8) = 1;
    *(undefined8 *)(namelist__abi_cxx11_ + 0x10) = 0;
    *(undefined8 *)(namelist__abi_cxx11_ + 0x18) = 0;
    *(undefined4 *)(namelist__abi_cxx11_ + 0x20) = 0x3f800000;
    *(undefined8 *)(namelist__abi_cxx11_ + 0x28) = 0;
    *(undefined8 *)(namelist__abi_cxx11_ + 0x30) = 0;
  }
  p_Var1 = namelist__abi_cxx11_;
  std::__cxx11::string::string((string *)local_38,name,&local_41);
  local_40 = p_Var1;
  pVar2 = std::
          _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,ctemplate::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
          ::
          _M_insert<std::__cxx11::string,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                    (p_Var1,(string *)local_38);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0]);
  }
  return *(char **)((long)pVar2.first.
                          super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                          ._M_cur.
                          super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                   + 8);
}

Assistant:

const char* TemplateNamelist::RegisterTemplate(const char* name) {
  if (!namelist_) {
    namelist_ = new NameListType;
  }
  pair<NameListType::iterator, bool> insert_result = namelist_->insert(name);
  // return a pointer to the entry corresponding to name;
  return insert_result.first->c_str();
}